

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.h
# Opt level: O0

void __thiscall testing::internal::MutexBase::AssertHeld(MutexBase *this)

{
  pthread_t __thread1;
  bool bVar1;
  int iVar2;
  pthread_t __thread2;
  ostream *poVar3;
  bool local_25;
  GTestLog local_14;
  MutexBase *local_10;
  MutexBase *this_local;
  
  local_25 = false;
  local_10 = this;
  if ((this->has_owner_ & 1U) != 0) {
    __thread1 = this->owner_;
    __thread2 = pthread_self();
    iVar2 = pthread_equal(__thread1,__thread2);
    local_25 = iVar2 != 0;
  }
  bVar1 = IsTrue(local_25);
  if (!bVar1) {
    GTestLog::GTestLog(&local_14,GTEST_FATAL,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/kumina[P]awssyncer/contrib/googletest-release-1.8.0/googletest/include/gtest/internal/gtest-port.h"
                       ,0x79a);
    poVar3 = GTestLog::GetStream(&local_14);
    poVar3 = std::operator<<(poVar3,
                             "Condition has_owner_ && pthread_equal(owner_, pthread_self()) failed. "
                            );
    poVar3 = std::operator<<(poVar3,"The current thread is not holding the mutex @");
    std::ostream::operator<<(poVar3,this);
    GTestLog::~GTestLog(&local_14);
  }
  return;
}

Assistant:

void AssertHeld() const {
    GTEST_CHECK_(has_owner_ && pthread_equal(owner_, pthread_self()))
        << "The current thread is not holding the mutex @" << this;
  }